

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdLoadExtend<wabt::interp::Simd<short,(unsigned_char)8>,wabt::interp::Simd<signed_char,(unsigned_char)8>>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  RunResult RVar1;
  RunResult RVar2;
  undefined1 auVar3 [16];
  Value value;
  Simd<signed_char,_(unsigned_char)__b_> local_10;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  RVar1 = Load<wabt::interp::Simd<signed_char,(unsigned_char)8>>(this,instr,&local_10,out_trap);
  RVar2 = Trap;
  if (RVar1 == Ok) {
    auVar10._8_6_ = 0;
    auVar10[0] = local_10.v[0];
    auVar10[1] = local_10.v[1];
    auVar10[2] = local_10.v[2];
    auVar10[3] = local_10.v[3];
    auVar10[4] = local_10.v[4];
    auVar10[5] = local_10.v[5];
    auVar10[6] = local_10.v[6];
    auVar10[7] = local_10.v[7];
    auVar10[0xe] = local_10.v[7];
    auVar10[0xf] = local_10.v[7];
    auVar9._14_2_ = auVar10._14_2_;
    auVar9._8_5_ = 0;
    auVar9[0] = local_10.v[0];
    auVar9[1] = local_10.v[1];
    auVar9[2] = local_10.v[2];
    auVar9[3] = local_10.v[3];
    auVar9[4] = local_10.v[4];
    auVar9[5] = local_10.v[5];
    auVar9[6] = local_10.v[6];
    auVar9[7] = local_10.v[7];
    auVar9[0xd] = local_10.v[6];
    auVar8._13_3_ = auVar9._13_3_;
    auVar8._8_4_ = 0;
    auVar8[0] = local_10.v[0];
    auVar8[1] = local_10.v[1];
    auVar8[2] = local_10.v[2];
    auVar8[3] = local_10.v[3];
    auVar8[4] = local_10.v[4];
    auVar8[5] = local_10.v[5];
    auVar8[6] = local_10.v[6];
    auVar8[7] = local_10.v[7];
    auVar8[0xc] = local_10.v[6];
    auVar7._12_4_ = auVar8._12_4_;
    auVar7._8_3_ = 0;
    auVar7[0] = local_10.v[0];
    auVar7[1] = local_10.v[1];
    auVar7[2] = local_10.v[2];
    auVar7[3] = local_10.v[3];
    auVar7[4] = local_10.v[4];
    auVar7[5] = local_10.v[5];
    auVar7[6] = local_10.v[6];
    auVar7[7] = local_10.v[7];
    auVar7[0xb] = local_10.v[5];
    auVar6._11_5_ = auVar7._11_5_;
    auVar6._8_2_ = 0;
    auVar6[0] = local_10.v[0];
    auVar6[1] = local_10.v[1];
    auVar6[2] = local_10.v[2];
    auVar6[3] = local_10.v[3];
    auVar6[4] = local_10.v[4];
    auVar6[5] = local_10.v[5];
    auVar6[6] = local_10.v[6];
    auVar6[7] = local_10.v[7];
    auVar6[10] = local_10.v[5];
    auVar5._10_6_ = auVar6._10_6_;
    auVar5[8] = 0;
    auVar5[0] = local_10.v[0];
    auVar5[1] = local_10.v[1];
    auVar5[2] = local_10.v[2];
    auVar5[3] = local_10.v[3];
    auVar5[4] = local_10.v[4];
    auVar5[5] = local_10.v[5];
    auVar5[6] = local_10.v[6];
    auVar5[7] = local_10.v[7];
    auVar5[9] = local_10.v[4];
    auVar4._9_7_ = auVar5._9_7_;
    auVar4[8] = local_10.v[4];
    auVar4[0] = local_10.v[0];
    auVar4[1] = local_10.v[1];
    auVar4[2] = local_10.v[2];
    auVar4[3] = local_10.v[3];
    auVar4[4] = local_10.v[4];
    auVar4[5] = local_10.v[5];
    auVar4[6] = local_10.v[6];
    auVar4[7] = local_10.v[7];
    auVar3._8_8_ = auVar4._8_8_;
    auVar3[7] = local_10.v[3];
    auVar3[6] = local_10.v[3];
    auVar3[5] = local_10.v[2];
    auVar3[4] = local_10.v[2];
    auVar3[3] = local_10.v[1];
    auVar3[2] = local_10.v[1];
    auVar3[0] = local_10.v[0];
    auVar3[1] = auVar3[0];
    value.field_0 = (anon_union_16_6_113bff37_for_Value_0)psraw(auVar3,8);
    Push(this,value);
    RVar2 = Ok;
  }
  return RVar2;
}

Assistant:

RunResult Thread::DoSimdLoadExtend(Instr instr, Trap::Ptr* out_trap) {
  T val;
  if (Load<T>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result[i] = val[i];
  }
  Push(result);
  return RunResult::Ok;
}